

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O0

void wasm::ModuleUtils::iterTableSegments<wasm::TranslateToFuzzReader::finalizeTable()::__0>
               (Module *wasm,Name table,anon_class_16_2_f8897cbb visitor)

{
  bool bVar1;
  reference this;
  pointer pEVar2;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *segment;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
  *__range2;
  Module *wasm_local;
  anon_class_16_2_f8897cbb visitor_local;
  Name table_local;
  
  visitor_local.this = (TranslateToFuzzReader *)visitor.table;
  wasm_local = (Module *)visitor.this;
  visitor_local.table = table.super_IString.str._M_len;
  bVar1 = IString::is((IString *)&visitor_local.table);
  if (bVar1) {
    __end2 = std::
             vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
             ::begin((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                      *)(wasm + 0x60));
    segment = (unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> *)
              std::
              vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
              ::end((vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     *)(wasm + 0x60));
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
                                       *)&segment), bVar1) {
      this = __gnu_cxx::
             __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
             ::operator*(&__end2);
      pEVar2 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
               operator->(this);
      bVar1 = IString::operator==(&(pEVar2->table).super_IString,(IString *)&visitor_local.table);
      if (bVar1) {
        pEVar2 = std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>::
                 get(this);
        TranslateToFuzzReader::finalizeTable::anon_class_16_2_f8897cbb::operator()
                  ((anon_class_16_2_f8897cbb *)&wasm_local,pEVar2);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_*,_std::vector<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>_>
      ::operator++(&__end2);
    }
    return;
  }
  __assert_fail("table.is() && \"Table name must not be null\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/module-utils.h"
                ,0x85,
                "void wasm::ModuleUtils::iterTableSegments(Module &, Name, T) [T = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp:803:26)]"
               );
}

Assistant:

inline void iterTableSegments(Module& wasm, Name table, T visitor) {
  // Just a precaution so that we don't iterate over passive elem segments by
  // accident
  assert(table.is() && "Table name must not be null");

  for (auto& segment : wasm.elementSegments) {
    if (segment->table == table) {
      visitor(segment.get());
    }
  }
}